

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::Options::checked_parse_arg
          (Options *this,int argc,char **argv,int *current,shared_ptr<cxxopts::OptionDetails> *value
          ,string *name)

{
  __shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  missing_argument_exception *this_00;
  allocator local_71;
  string local_70;
  __shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (*current + 1 < argc) {
    if (*argv[(long)*current + 1] == '-') {
      iVar2 = (*((((value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->m_value).
                 super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Value[4])();
      if ((char)iVar2 != '\0') {
        std::__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,
                   &value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>);
        std::__cxx11::string::string((string *)&local_70,"",&local_71);
        OptionDetails::parse(local_40._M_ptr,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        p_Var1 = &local_40;
        goto LAB_001347a7;
      }
    }
    std::__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string((string *)&local_70,argv[(long)*current + 1],&local_71);
    OptionDetails::parse(local_50._M_ptr,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    *current = *current + 1;
  }
  else {
    iVar2 = (*((((value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_value).
               super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Value[4])();
    if ((char)iVar2 == '\0') {
      this_00 = (missing_argument_exception *)__cxa_allocate_exception(0x28);
      missing_argument_exception::missing_argument_exception(this_00,name);
      __cxa_throw(this_00,&missing_argument_exception::typeinfo,OptionException::~OptionException);
    }
    std::__shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               &value->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string((string *)&local_70,"",&local_71);
    OptionDetails::parse(local_30._M_ptr,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    p_Var1 = &local_30;
LAB_001347a7:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  }
  return;
}

Assistant:

void
Options::checked_parse_arg
(
  int argc,
  char* argv[],
  int& current,
  std::shared_ptr<OptionDetails> value,
  const std::string& name
)
{
  if (current + 1 >= argc)
  {
    if (value->value().has_implicit())
    {
      parse_option(value, name, "");
    }
    else
    {
      throw missing_argument_exception(name);
    }
  }
  else
  {
    if (argv[current + 1][0] == '-' && value->value().has_implicit())
    {
      parse_option(value, name, "");
    }
    else
    {
      parse_option(value, name, argv[current + 1]);
      ++current;
    }
  }
}